

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.cpp
# Opt level: O3

void __thiscall
DecHeap::DecHeap(DecHeap *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *heap)

{
  pointer ppVar1;
  pointer puVar2;
  unsigned_long *puVar3;
  long lVar4;
  __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  __last;
  unsigned_long uVar5;
  __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  __first;
  _Iter_comp_iter<std::greater<std::pair<unsigned_long,_unsigned_long>_>_> __cmp;
  _Iter_comp_iter<std::greater<std::pair<unsigned_long,_unsigned_long>_>_> local_29;
  unsigned_long local_28;
  
  (this->idx_map).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->idx_map).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->heap).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->idx_map).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->heap).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->heap).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28 = 0;
  puVar2 = (heap->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((heap->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish == puVar2) {
    __last._M_current = (pair<unsigned_long,_unsigned_long> *)0x0;
    __first._M_current = (pair<unsigned_long,_unsigned_long> *)0x0;
  }
  else {
    do {
      std::
      vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
      ::emplace_back<unsigned_long_const&,unsigned_long&>
                ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                  *)this,puVar2 + local_28,&local_28);
      local_28 = local_28 + 1;
      puVar2 = (heap->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (local_28 <
             (ulong)((long)(heap->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                           ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3));
    __first._M_current =
         (this->heap).
         super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    __last._M_current =
         (this->heap).
         super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  std::
  __make_heap<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,unsigned_long>*,std::vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<std::pair<unsigned_long,unsigned_long>>>>
            (__first,__last,&local_29);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->idx_map,
             (long)(heap->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(heap->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                   .super__Vector_impl_data._M_start >> 3);
  ppVar1 = (this->heap).
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->heap).
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1;
  if (lVar4 != 0) {
    lVar4 = lVar4 >> 4;
    puVar2 = (this->idx_map).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar3 = &ppVar1->second;
    uVar5 = 0;
    do {
      puVar2[*puVar3] = uVar5;
      uVar5 = uVar5 + 1;
      puVar3 = puVar3 + 2;
    } while (lVar4 + (ulong)(lVar4 == 0) != uVar5);
  }
  return;
}

Assistant:

DecHeap::DecHeap(const std::vector<size_t> &heap) {
    for (size_t i = 0; i < heap.size(); ++i) {
        this->heap.emplace_back(heap[i], i);
    }
    std::make_heap(this->heap.begin(), this->heap.end(), std::greater<std::pair<size_t, size_t>>());
    this->idx_map.resize(heap.size());
    for (size_t i = 0; i < this->heap.size(); ++i) {
        this->idx_map[this->heap[i].second] = i;
    }
}